

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::timestamp_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::NanosecondsOperator>>
               (timestamp_t *ldata,long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  ulong *puVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  timestamp_t tVar4;
  byte bVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  long *plVar8;
  timestamp_t *ptVar9;
  bool bVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  dtime_t dVar12;
  long lVar13;
  idx_t idx_in_entry_1;
  ulong uVar14;
  ulong uVar15;
  idx_t idx_in_entry;
  ulong uVar16;
  idx_t iVar17;
  unsigned_long uVar18;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  idx_t local_80;
  idx_t local_78;
  long *local_70;
  ValidityMask *local_68;
  timestamp_t *local_60;
  ulong local_58;
  buffer_ptr<ValidityBuffer> *local_50;
  ulong local_48;
  timestamp_t *local_40;
  long *local_38;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_78 = count;
  local_70 = result_data;
  local_68 = mask;
  local_60 = ldata;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar14 = 0;
      do {
        tVar4.value = local_60[uVar14].value;
        bVar10 = Value::IsFinite<duckdb::timestamp_t>(tVar4);
        iVar17 = local_78;
        if (bVar10) {
          dVar12 = Timestamp::GetTime(tVar4);
          lVar13 = (dVar12.micros % 60000000) * 1000;
          iVar17 = local_78;
        }
        else {
          if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            local_80 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_98,&local_80);
            p_Var7 = p_Stack_90;
            peVar6 = local_98;
            local_98 = (element_type *)0x0;
            p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var3 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar6;
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var7;
            if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
            }
            if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
            }
            pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).
                                  validity_data);
            (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                 (unsigned_long *)
                 (pTVar11->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar5 = (byte)uVar14 & 0x3f;
          puVar1 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                   (uVar14 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
          lVar13 = 0;
        }
        local_70[uVar14] = lVar13;
        uVar14 = uVar14 + 1;
      } while (iVar17 != uVar14);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_80 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_98,(unsigned_long **)mask,&local_80);
      p_Var7 = p_Stack_90;
      peVar6 = local_98;
      local_98 = (element_type *)0x0;
      p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var3 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar6;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var7;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
      }
      pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data)
      ;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar11->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      count = local_78;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar2;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_58 = count + 0x3f >> 6;
      local_50 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
      local_48 = 0;
      uVar14 = 0;
      do {
        ptVar9 = local_60;
        plVar8 = local_70;
        puVar2 = (local_68->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          uVar18 = 0xffffffffffffffff;
        }
        else {
          uVar18 = puVar2[local_48];
        }
        uVar15 = uVar14 + 0x40;
        if (local_78 <= uVar14 + 0x40) {
          uVar15 = local_78;
        }
        uVar16 = uVar15;
        if (uVar18 != 0) {
          uVar16 = uVar14;
          if (uVar18 == 0xffffffffffffffff) {
            if (uVar14 < uVar15) {
              do {
                tVar4.value = ptVar9[uVar16].value;
                bVar10 = Value::IsFinite<duckdb::timestamp_t>(tVar4);
                if (bVar10) {
                  dVar12 = Timestamp::GetTime(tVar4);
                  lVar13 = (dVar12.micros % 60000000) * 1000;
                }
                else {
                  if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                      (unsigned_long *)0x0) {
                    local_80 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)&local_98,&local_80);
                    p_Var7 = p_Stack_90;
                    peVar6 = local_98;
                    local_98 = (element_type *)0x0;
                    p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var3 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data
                             .internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal
                    .
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = peVar6;
                    (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal
                    .
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = p_Var7;
                    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                    }
                    if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                    }
                    pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                              operator->(local_50);
                    (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                         (unsigned_long *)
                         (pTVar11->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>;
                  }
                  bVar5 = (byte)uVar16 & 0x3f;
                  puVar1 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                           (uVar16 >> 6);
                  *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
                  lVar13 = 0;
                }
                plVar8[uVar16] = lVar13;
                uVar16 = uVar16 + 1;
              } while (uVar15 != uVar16);
            }
          }
          else if (uVar14 < uVar15) {
            local_38 = local_70 + uVar14;
            local_40 = local_60 + uVar14;
            uVar16 = 0;
            do {
              if ((uVar18 >> (uVar16 & 0x3f) & 1) != 0) {
                tVar4.value = local_40[uVar16].value;
                bVar10 = Value::IsFinite<duckdb::timestamp_t>(tVar4);
                if (bVar10) {
                  dVar12 = Timestamp::GetTime(tVar4);
                  lVar13 = (dVar12.micros % 60000000) * 1000;
                }
                else {
                  if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                      (unsigned_long *)0x0) {
                    local_80 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)&local_98,&local_80);
                    p_Var7 = p_Stack_90;
                    peVar6 = local_98;
                    local_98 = (element_type *)0x0;
                    p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var3 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data
                             .internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal
                    .
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = peVar6;
                    (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal
                    .
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = p_Var7;
                    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                    }
                    if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                    }
                    pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                              operator->(local_50);
                    (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                         (unsigned_long *)
                         (pTVar11->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>;
                  }
                  bVar5 = (byte)(uVar16 + uVar14) & 0x3f;
                  puVar1 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                           (uVar16 + uVar14 >> 6);
                  *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
                  lVar13 = 0;
                }
                local_38[uVar16] = lVar13;
              }
              uVar16 = uVar16 + 1;
            } while ((uVar14 - uVar15) + uVar16 != 0);
            uVar16 = uVar14 + uVar16;
          }
        }
        local_48 = local_48 + 1;
        uVar14 = uVar16;
      } while (local_48 != local_58);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}